

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::Connect(RWSocket *this,string *ip,uint16_t port)

{
  uint64_t *__k;
  Address *this_00;
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  SingletonLogger *this_02;
  mapped_type *pmVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  long *in_FS_OFFSET;
  SysCallInt64Result SVar10;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Event *pEVar8;
  
  if (this->_event == (Event *)0x0) {
    peVar2 = (((this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar7 = (*peVar2->_vptr_Alloter[3])(peVar2,0x28);
    pEVar8 = (Event *)CONCAT44(extraout_var,iVar7);
    if (pEVar8 == (Event *)0x0) {
      pEVar8 = (Event *)0x0;
    }
    else {
      pEVar8->_vptr_Event = (_func_int **)&PTR__Event_001260a8;
      pEVar8->_data = (void *)0x0;
      pEVar8->_event_type = 0;
      (pEVar8->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pEVar8->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    this->_event = pEVar8;
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    peVar4 = local_58;
    local_40 = local_58;
    local_38._M_pi = p_Stack_50;
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pEVar8->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pEVar8->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_38);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
  }
  bVar6 = Address::IsIpv4(ip);
  __k = &(this->super_Socket)._sock;
  if ((this->super_Socket)._sock == 0) {
    SVar10 = OsHandle::TcpSocket(bVar6);
    if (SVar10._return_value < 0) {
      this_02 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Error
                (this_02,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/rw_socket.cpp"
                 ,0x84,"create socket failed. error:%d",(ulong)(uint)SVar10._errno);
      return;
    }
    *__k = SVar10._return_value;
  }
  this_00 = &(this->super_Socket)._addr;
  (this->super_Socket)._addr._address_type = AT_IPV6 - bVar6;
  Address::SetIp(this_00,ip);
  (this->super_Socket)._addr._port = port;
  this_03 = (this->super_Socket)._event_actions.
            super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar7 = this_03->_M_use_count;
    do {
      if (iVar7 == 0) {
        this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_03->_M_use_count;
      bVar6 = iVar7 == iVar1;
      if (bVar6) {
        this_03->_M_use_count = iVar7 + 1;
        iVar1 = iVar7;
      }
      iVar7 = iVar1;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_03 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_03->_M_use_count == 0;
  }
  peVar3 = (this->super_Socket)._event_actions.
           super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(peVar3 == (element_type *)0x0 | bVar6)) {
    LOCK();
    (this->_connecting)._M_base._M_i = true;
    UNLOCK();
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    __connecting_socket_map::__tls_init();
    pmVar9 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(*in_FS_OFFSET + -0x80),__k);
    p_Var5 = p_Stack_50;
    peVar4 = local_58;
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (pmVar9->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (pmVar9->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
    (pmVar9->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         p_Var5;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
    (*peVar3->_vptr_EventActions[7])(peVar3,this->_event,this_00);
  }
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  return;
}

Assistant:

void RWSocket::Connect(const std::string& ip, uint16_t port) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    bool use_ipv4 = false;
    if (Address::IsIpv4(ip)) {
        use_ipv4 = true;
    }
    if (_sock == 0) {
        auto ret = OsHandle::TcpSocket(use_ipv4);
        if (ret._return_value < 0) {
            LOG_ERROR("create socket failed. error:%d", ret._errno);
            return;
        }
        _sock = ret._return_value;
    }

    _addr.SetType(use_ipv4 ? AT_IPV4 : AT_IPV6);
    _addr.SetIp(ip);
    _addr.SetAddrPort(port);

    auto actions = GetEventActions();
    if (actions) {
        _connecting = true;
        __connecting_socket_map[_sock] = shared_from_this();
        actions->AddConnection(_event, _addr);
    }
}